

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLASTConstantExpression.cpp
# Opt level: O0

void __thiscall
MathML::AST::ConstantExpression::ConstantExpression(ConstantExpression *this,double val)

{
  INode *in_RDI;
  undefined8 in_XMM0_Qa;
  
  INode::INode(in_RDI);
  in_RDI->_vptr_INode = (_func_int **)&PTR__ConstantExpression_00e6dbd8;
  std::__cxx11::string::string((string *)(in_RDI + 3));
  (*in_RDI->_vptr_INode[6])(in_XMM0_Qa);
  return;
}

Assistant:

ConstantExpression::ConstantExpression( double val )
        {
            setValue( val );
        }